

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

int __thiscall
QFileDialogPrivate::select
          (QFileDialogPrivate *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  bool bVar1;
  QFlags<QItemSelectionModel::SelectionFlag> QVar2;
  QItemSelectionModel *pQVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  QModelIndex *index;
  QModelIndex *idx;
  QFileDialogPrivate *pQVar5;
  
  index = (QModelIndex *)CONCAT44(in_register_00000034,__nfds);
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8 =
       &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x10 =
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = this;
  mapFromSource(this,index);
  bVar1 = QModelIndex::isValid((QModelIndex *)this);
  if (bVar1) {
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
               &index[0x24].m);
    pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
    uVar4 = QItemSelectionModel::isSelected((QModelIndex *)pQVar3);
    if ((uVar4 & 1) == 0) {
      QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                ((QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_> *)
                 &index[0x24].m);
      pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
      QVar2 = ::operator|((enum_type)((ulong)this >> 0x20),(enum_type)this);
      (**(code **)(*(long *)pQVar3 + 0x68))
                (pQVar3,pQVar5,
                 QVar2.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
                 super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
    }
  }
  return (int)this;
}

Assistant:

QModelIndex QFileDialogPrivate::select(const QModelIndex &index) const {
    Q_ASSERT(index.isValid() ? index.model() == model : true);

    QModelIndex idx = mapFromSource(index);
    if (idx.isValid() && !qFileDialogUi->listView->selectionModel()->isSelected(idx))
        qFileDialogUi->listView->selectionModel()->select(idx,
            QItemSelectionModel::Select | QItemSelectionModel::Rows);
    return idx;
}